

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O3

bool __thiscall spvtools::opt::Instruction::IsVulkanStorageBuffer(Instruction *this)

{
  IRContext *pIVar1;
  DefUseManager *pDVar2;
  DecorationManager *pDVar3;
  uint32_t uVar4;
  Op OVar5;
  Instruction *this_00;
  code *pcVar6;
  uint uVar7;
  _Any_data *p_Var8;
  bool is_buffer_block;
  undefined1 local_59;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  if (this->opcode_ != OpTypePointer) {
    return false;
  }
  pIVar1 = this->context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  pDVar2 = (pIVar1->def_use_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  uVar7 = (this->has_result_id_ & 1) + 1;
  if (this->has_type_id_ == false) {
    uVar7 = (uint)this->has_result_id_;
  }
  uVar4 = GetSingleWordOperand(this,uVar7 + 1);
  this_00 = analysis::DefUseManager::GetDef(pDVar2,uVar4);
  OVar5 = this_00->opcode_;
  if ((OVar5 & ~OpUndef) == OpTypeArray) {
    pIVar1 = this->context_;
    if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar1);
    }
    pDVar2 = (pIVar1->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    uVar4 = (this_00->has_result_id_ & 1) + 1;
    if (this_00->has_type_id_ == false) {
      uVar4 = (uint)this_00->has_result_id_;
    }
    uVar4 = GetSingleWordOperand(this_00,uVar4);
    this_00 = analysis::DefUseManager::GetDef(pDVar2,uVar4);
    OVar5 = this_00->opcode_;
  }
  if (OVar5 == OpTypeStruct) {
    uVar4 = (this->has_result_id_ & 1) + 1;
    if (this->has_type_id_ == false) {
      uVar4 = (uint)this->has_result_id_;
    }
    uVar4 = GetSingleWordOperand(this,uVar4);
    if (uVar4 == 0xc) {
      local_59 = 0;
      pIVar1 = this->context_;
      if ((pIVar1->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
        IRContext::BuildDecorationManager(pIVar1);
      }
      pDVar3 = (pIVar1->decoration_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
               _M_head_impl;
      uVar4 = 0;
      if (this_00->has_result_id_ == true) {
        uVar4 = GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
      }
      local_58._8_8_ = 0;
      local_58._M_unused._M_object = &local_59;
      local_40 = std::
                 _Function_handler<void_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.cpp:411:9)>
                 ::_M_invoke;
      local_48 = std::
                 _Function_handler<void_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.cpp:411:9)>
                 ::_M_manager;
      analysis::DecorationManager::ForEachDecoration
                (pDVar3,uVar4,2,(function<void_(const_spvtools::opt::Instruction_&)> *)&local_58);
      if (local_48 == (code *)0x0) {
        return (bool)local_59;
      }
      p_Var8 = &local_58;
      pcVar6 = local_48;
    }
    else {
      if (uVar4 != 2) goto LAB_00224a9c;
      local_59 = 0;
      pIVar1 = this->context_;
      if ((pIVar1->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
        IRContext::BuildDecorationManager(pIVar1);
      }
      pDVar3 = (pIVar1->decoration_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
               _M_head_impl;
      uVar4 = 0;
      if (this_00->has_result_id_ == true) {
        uVar4 = GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
      }
      local_38._8_8_ = 0;
      local_38._M_unused._M_object = &local_59;
      local_20 = std::
                 _Function_handler<void_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.cpp:405:9)>
                 ::_M_invoke;
      local_28 = std::
                 _Function_handler<void_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.cpp:405:9)>
                 ::_M_manager;
      analysis::DecorationManager::ForEachDecoration
                (pDVar3,uVar4,3,(function<void_(const_spvtools::opt::Instruction_&)> *)&local_38);
      if (local_28 == (code *)0x0) {
        return (bool)local_59;
      }
      p_Var8 = &local_38;
      pcVar6 = local_28;
    }
    (*pcVar6)(p_Var8,p_Var8,__destroy_functor);
  }
  else {
LAB_00224a9c:
    local_59 = 0;
  }
  return (bool)local_59;
}

Assistant:

bool Instruction::IsVulkanStorageBuffer() const {
  // Is there a difference between a "Storage buffer" and a "dynamic storage
  // buffer" in SPIR-V and do we care about the difference?
  if (opcode() != spv::Op::OpTypePointer) {
    return false;
  }

  Instruction* base_type =
      context()->get_def_use_mgr()->GetDef(GetSingleWordInOperand(1));

  // Unpack the optional layer of arraying.
  if (base_type->opcode() == spv::Op::OpTypeArray ||
      base_type->opcode() == spv::Op::OpTypeRuntimeArray) {
    base_type = context()->get_def_use_mgr()->GetDef(
        base_type->GetSingleWordInOperand(0));
  }

  if (base_type->opcode() != spv::Op::OpTypeStruct) {
    return false;
  }

  spv::StorageClass storage_class =
      spv::StorageClass(GetSingleWordInOperand(kPointerTypeStorageClassIndex));
  if (storage_class == spv::StorageClass::Uniform) {
    bool is_buffer_block = false;
    context()->get_decoration_mgr()->ForEachDecoration(
        base_type->result_id(), uint32_t(spv::Decoration::BufferBlock),
        [&is_buffer_block](const Instruction&) { is_buffer_block = true; });
    return is_buffer_block;
  } else if (storage_class == spv::StorageClass::StorageBuffer) {
    bool is_block = false;
    context()->get_decoration_mgr()->ForEachDecoration(
        base_type->result_id(), uint32_t(spv::Decoration::Block),
        [&is_block](const Instruction&) { is_block = true; });
    return is_block;
  }
  return false;
}